

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mpi_check_small_factors(mbedtls_mpi *X)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  mbedtls_mpi_uint r;
  mbedtls_mpi Y;
  mbedtls_mpi_uint local_58;
  ulong local_50;
  mbedtls_mpi local_48;
  
  iVar2 = -0xe;
  if ((*X->p & 1) != 0) {
    lVar3 = 0;
    do {
      uVar1 = *(uint *)((long)small_prime + lVar3);
      local_50 = (ulong)uVar1;
      local_48.s = 1;
      local_48.n = 1;
      local_48.p = &local_50;
      iVar2 = mbedtls_mpi_cmp_mpi(X,&local_48);
      if (iVar2 < 1) {
        return 1;
      }
      iVar2 = mbedtls_mpi_mod_int(&local_58,X,(long)(int)uVar1);
      if (iVar2 != 0) {
        return iVar2;
      }
      if (local_58 == 0) {
        return -0xe;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x29c);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int mpi_check_small_factors( const mbedtls_mpi *X )
{
    int ret = 0;
    size_t i;
    mbedtls_mpi_uint r;

    if( ( X->p[0] & 1 ) == 0 )
        return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );

    for( i = 0; small_prime[i] > 0; i++ )
    {
        if( mbedtls_mpi_cmp_int( X, small_prime[i] ) <= 0 )
            return( 1 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, small_prime[i] ) );

        if( r == 0 )
            return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );
    }

cleanup:
    return( ret );
}